

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O3

S2Point * S2::GetCentroid(S2Point *__return_storage_ptr__,S2Shape *shape)

{
  int iVar1;
  uint uVar2;
  size_type in_RCX;
  int chain_id;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  S2PointLoopSpan loop;
  S2PointSpan polyline;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_88;
  S2Point local_68 [2];
  
  __return_storage_ptr__->c_[2] = 0.0;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  local_88.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (*shape->_vptr_S2Shape[4])(shape);
  uVar2 = (*shape->_vptr_S2Shape[6])(shape);
  if ((int)uVar2 < 1) {
    __return_storage_ptr__->c_[0] = 0.0;
  }
  else {
    dVar4 = 0.0;
    dVar5 = 0.0;
    uVar3 = 0;
    dVar6 = 0.0;
    do {
      chain_id = (int)uVar3;
      if (iVar1 == 1) {
        GetChainVertices(shape,chain_id,&local_88);
        polyline.ptr_ =
             (pointer)(((long)local_88.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_88.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
        ;
        polyline.len_ = in_RCX;
        GetCentroid(local_68,(S2 *)local_88.
                                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,polyline);
      }
      else if (iVar1 == 0) {
        (*shape->_vptr_S2Shape[3])(local_68,shape,uVar3);
      }
      else {
        GetChainVertices(shape,chain_id,&local_88);
        loop.super_S2PointSpan.len_ =
             ((long)local_88.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        loop.super_S2PointSpan.ptr_ =
             local_88.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
             .super__Vector_impl_data._M_start;
        GetCentroid(local_68,loop);
      }
      dVar4 = local_68[0].c_[0] + dVar4;
      dVar5 = local_68[0].c_[1] + dVar5;
      dVar6 = local_68[0].c_[2] + dVar6;
      uVar3 = (ulong)(chain_id + 1U);
    } while (uVar2 != chain_id + 1U);
    __return_storage_ptr__->c_[2] = dVar6;
    __return_storage_ptr__->c_[0] = dVar4;
    __return_storage_ptr__->c_[1] = dVar5;
    if ((S2 *)local_88.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (S2 *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCentroid(const S2Shape& shape) {
  S2Point centroid;
  vector<S2Point> vertices;
  int dimension = shape.dimension();
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    switch (dimension) {
      case 0:
        centroid += shape.edge(chain_id).v0;
        break;
      case 1:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointSpan(vertices));
        break;
      default:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointLoopSpan(vertices));
        break;
    }
  }
  return centroid;
}